

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O0

EStatusCodeAndObjectIDTypeList * __thiscall
PDFWriter::CreateFormXObjectsFromPDF
          (EStatusCodeAndObjectIDTypeList *__return_storage_ptr__,PDFWriter *this,
          IByteReaderWithPosition *inPDFStream,PDFPageRange *inPageRange,
          EPDFPageBox inPageBoxToUseAsFormBox,double *inTransformationMatrix,
          ObjectIDTypeList *inCopyAdditionalObjects,PDFParsingOptions *inParsingOptions)

{
  list<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  double *local_40;
  double *inTransformationMatrix_local;
  PDFPageRange *pPStack_30;
  EPDFPageBox inPageBoxToUseAsFormBox_local;
  PDFPageRange *inPageRange_local;
  IByteReaderWithPosition *inPDFStream_local;
  PDFWriter *this_local;
  
  local_58.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  local_58.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_58.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node._M_size =
       0;
  local_40 = inTransformationMatrix;
  inTransformationMatrix_local._4_4_ = inPageBoxToUseAsFormBox;
  pPStack_30 = inPageRange;
  inPageRange_local = (PDFPageRange *)inPDFStream;
  inPDFStream_local = (IByteReaderWithPosition *)this;
  this_local = (PDFWriter *)__return_storage_ptr__;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list(&local_58);
  PDFHummus::DocumentContext::CreateFormXObjectsFromPDF
            (__return_storage_ptr__,&this->mDocumentContext,inPDFStream,inParsingOptions,inPageRange
             ,inPageBoxToUseAsFormBox,inTransformationMatrix,inCopyAdditionalObjects,&local_58);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list(&local_58);
  return __return_storage_ptr__;
}

Assistant:

EStatusCodeAndObjectIDTypeList PDFWriter::CreateFormXObjectsFromPDF(IByteReaderWithPosition* inPDFStream,
																	const PDFPageRange& inPageRange,
																	EPDFPageBox inPageBoxToUseAsFormBox,
																	const double* inTransformationMatrix,
																	const ObjectIDTypeList& inCopyAdditionalObjects,
																	const PDFParsingOptions& inParsingOptions)
{
	return mDocumentContext.CreateFormXObjectsFromPDF(inPDFStream,inParsingOptions,inPageRange,inPageBoxToUseAsFormBox,inTransformationMatrix,inCopyAdditionalObjects);
}